

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib654.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  WriteThis pooh;
  char *local_48;
  size_t local_40;
  int local_38;
  
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  uVar2 = curl_easy_init();
  iVar1 = curl_easy_setopt(uVar2,0x2712,URL);
  if (((iVar1 == 0) && (iVar1 = curl_easy_setopt(uVar2,0x29,1), iVar1 == 0)) &&
     (iVar1 = curl_easy_setopt(uVar2,0x2a,1), iVar1 == 0)) {
    local_48 = data;
    local_40 = strlen(data);
    local_38 = 0;
    uVar3 = curl_mime_init(uVar2);
    uVar4 = curl_mime_addpart(uVar3);
    curl_mime_data(uVar4,"hello",0xffffffffffffffff);
    curl_mime_name(uVar4,"greeting");
    curl_mime_type(uVar4,"application/X-Greeting");
    curl_mime_encoder(uVar4,"base64");
    lVar6 = 0;
    uVar5 = curl_slist_append(0,"X-Test-Number: 654");
    curl_mime_headers(uVar4,uVar5,1);
    uVar4 = curl_mime_addpart(uVar3);
    curl_mime_filedata(uVar4,"log/file654.txt");
    uVar4 = curl_mime_addpart(uVar3);
    curl_mime_data_cb(uVar4,0xffffffffffffffff,read_callback,0,free_callback,&local_48);
    iVar1 = curl_easy_setopt(uVar2,0x281d,uVar3);
    if (iVar1 != 0) goto LAB_00101346;
    lVar6 = curl_easy_duphandle(uVar2);
    if (lVar6 == 0) {
      lVar6 = 0;
      curl_mfprintf(_stderr,"curl_easy_duphandle() failed\n");
      iVar1 = 0x77;
      goto LAB_00101346;
    }
    curl_mime_free(uVar3);
    iVar1 = curl_easy_perform(uVar2);
    if (iVar1 == 0) {
      iVar1 = curl_easy_perform(lVar6);
      if (iVar1 == 0) {
        curl_easy_cleanup(lVar6);
        if (local_38 == 2) {
          lVar6 = 0;
          uVar3 = 0;
          iVar1 = 0;
          goto LAB_00101346;
        }
        curl_mfprintf(_stderr,"free_callback() called %d times instead of 2\n");
        iVar1 = 0x77;
        goto LAB_00101343;
      }
      pcVar7 = "curl_easy_perform(duplicated) failed\n";
    }
    else {
      pcVar7 = "curl_easy_perform(original) failed\n";
    }
    uVar3 = 0;
    curl_mfprintf(_stderr,pcVar7);
  }
  else {
LAB_00101343:
    lVar6 = 0;
    uVar3 = 0;
  }
LAB_00101346:
  curl_easy_cleanup(uVar2);
  curl_easy_cleanup(lVar6);
  curl_mime_free(uVar3);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURL *easy2 = NULL;
  curl_mime *mime = NULL;
  curl_mimepart *part;
  struct curl_slist *hdrs = NULL;
  CURLcode result;
  int res = TEST_ERR_FAILURE;
  struct WriteThis pooh;

  /*
   * Check proper copy/release of mime post data bound to a duplicated
   * easy handle.
   */

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  easy = curl_easy_init();

  /* First set the URL that is about to receive our POST. */
  test_setopt(easy, CURLOPT_URL, URL);

  /* get verbose debug output please */
  test_setopt(easy, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(easy, CURLOPT_HEADER, 1L);

  /* Prepare the callback structure. */
  pooh.readptr = data;
  pooh.sizeleft = (curl_off_t) strlen(data);
  pooh.freecount = 0;

  /* Build the mime tree. */
  mime = curl_mime_init(easy);
  part = curl_mime_addpart(mime);
  curl_mime_data(part, "hello", CURL_ZERO_TERMINATED);
  curl_mime_name(part, "greeting");
  curl_mime_type(part, "application/X-Greeting");
  curl_mime_encoder(part, "base64");
  hdrs = curl_slist_append(hdrs, "X-Test-Number: 654");
  curl_mime_headers(part, hdrs, TRUE);
  part = curl_mime_addpart(mime);
  curl_mime_filedata(part, "log/file654.txt");
  part = curl_mime_addpart(mime);
  curl_mime_data_cb(part, (curl_off_t) -1, read_callback, NULL, free_callback,
                    &pooh);

  /* Bind mime data to its easy handle. */
  test_setopt(easy, CURLOPT_MIMEPOST, mime);

  /* Duplicate the handle. */
  easy2 = curl_easy_duphandle(easy);
  if(!easy2) {
    fprintf(stderr, "curl_easy_duphandle() failed\n");
    res = TEST_ERR_FAILURE;
    goto test_cleanup;
  }

  /* Now free the mime structure: it should unbind it from the first
     easy handle. */
  curl_mime_free(mime);
  mime = NULL;  /* Already cleaned up. */

  /* Perform on the first handle: should not send any data. */
  result = curl_easy_perform(easy);
  if(result) {
    fprintf(stderr, "curl_easy_perform(original) failed\n");
    res = (int) result;
    goto test_cleanup;
  }

  /* Perform on the second handle: if the bound mime structure has not been
     duplicated properly, it should cause a valgrind error. */
  result = curl_easy_perform(easy2);
  if(result) {
    fprintf(stderr, "curl_easy_perform(duplicated) failed\n");
    res = (int) result;
    goto test_cleanup;
  }

  /* Free the duplicated handle: it should call free_callback again.
     If the mime copy was bad or not automatically released, valgrind
     will signal it. */
  curl_easy_cleanup(easy2);
  easy2 = NULL;  /* Already cleaned up. */

  if(pooh.freecount != 2) {
    fprintf(stderr, "free_callback() called %d times instead of 2\n",
            pooh.freecount);
    res = TEST_ERR_FAILURE;
    goto test_cleanup;
  }

test_cleanup:
  curl_easy_cleanup(easy);
  curl_easy_cleanup(easy2);
  curl_mime_free(mime);
  curl_global_cleanup();
  return res;
}